

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

char * __thiscall ImVector<char>::insert(ImVector<char> *this,char *it,char *v)

{
  int iVar1;
  int new_capacity;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar5 = this->Data;
  if (pcVar5 <= it) {
    iVar1 = this->Size;
    lVar3 = (long)iVar1;
    if (it <= pcVar5 + lVar3) {
      lVar4 = (long)it - (long)pcVar5;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          new_capacity = iVar2;
        }
        reserve(this,new_capacity);
        lVar3 = (long)this->Size;
        pcVar5 = this->Data;
      }
      if (lVar3 - lVar4 != 0 && lVar4 <= lVar3) {
        memmove(pcVar5 + lVar4 + 1,pcVar5 + lVar4,lVar3 - lVar4);
        pcVar5 = this->Data;
      }
      pcVar5[lVar4] = *v;
      this->Size = this->Size + 1;
      return this->Data + lVar4;
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<char>::insert(const T *, const T &) [T = char]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }